

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O2

void test_cpp_wrapper_delete_then_insert(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  cpp_wrapper_setup(tc,dict,ion_fill_edge_cases);
  cpp_wrapper_delete(tc,dict,0x3c,'\0',1,'\x01');
  cpp_wrapper_delete(tc,dict,4,'\0',1,'\x01');
  cpp_wrapper_delete(tc,dict,0x1f9,'\0',1,'\x01');
  cpp_wrapper_insert(tc,dict,0x3d,0x2c,'\x01');
  cpp_wrapper_insert(tc,dict,0x43,0x2a,'\x01');
  cpp_wrapper_insert(tc,dict,0x49,0x30,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_delete_then_insert(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	cpp_wrapper_setup(tc, dict, ion_fill_edge_cases);

	cpp_wrapper_delete(tc, dict, 60, err_ok, 1, boolean_true);
	cpp_wrapper_delete(tc, dict, 4, err_ok, 1, boolean_true);
	cpp_wrapper_delete(tc, dict, 505, err_ok, 1, boolean_true);

	cpp_wrapper_insert(tc, dict, 61, 44, boolean_true);
	cpp_wrapper_insert(tc, dict, 67, 42, boolean_true);
	cpp_wrapper_insert(tc, dict, 73, 48, boolean_true);
}